

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  cmMessenger *messenger;
  ostream *poVar4;
  ostringstream e;
  char *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_72_2_0a0279e7_for_Entry_0 local_198;
  ios_base local_138 [264];
  
  tgtType = this->TargetTypeValue;
  local_1d0 = value;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace(this->Makefile);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if (!bVar2) {
    return;
  }
  iVar3 = std::__cxx11::string::compare((char *)prop);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"NAME property is read-only\n",0x1b);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)prop);
    if ((iVar3 == 0) && (this->IsImportedTarget == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EXPORT_NAME property can\'t be set on imported targets (\"",
                 0x38);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)prop);
      if ((iVar3 == 0) && (this->IsImportedTarget == true)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",
                   0x34);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                            (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)prop);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)prop);
          if (iVar3 == 0) {
            if (local_1d0 == (char *)0x0) {
              return;
            }
            if (*local_1d0 == '\0') {
              return;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (this->Internal).Pointer,&local_1d0);
            cmMakefile::GetBacktrace(this->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                       (value_type *)local_1a8);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)prop);
            if (iVar3 == 0) {
              if (local_1d0 == (char *)0x0) {
                return;
              }
              if (*local_1d0 == '\0') {
                return;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &((this->Internal).Pointer)->CompileOptionsEntries,&local_1d0);
              cmMakefile::GetBacktrace(this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->CompileOptionsBacktraces,
                         (value_type *)local_1a8);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)prop);
              if (iVar3 == 0) {
                if (local_1d0 == (char *)0x0) {
                  return;
                }
                if (*local_1d0 == '\0') {
                  return;
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &((this->Internal).Pointer)->CompileFeaturesEntries,&local_1d0);
                cmMakefile::GetBacktrace(this->Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                           (value_type *)local_1a8);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)prop);
                if (iVar3 == 0) {
                  if (local_1d0 == (char *)0x0) {
                    return;
                  }
                  if (*local_1d0 == '\0') {
                    return;
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &((this->Internal).Pointer)->CompileDefinitionsEntries,&local_1d0);
                  cmMakefile::GetBacktrace(this->Makefile);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                             (value_type *)local_1a8);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)prop);
                  if (iVar3 == 0) {
                    if (local_1d0 == (char *)0x0) {
                      return;
                    }
                    if (*local_1d0 == '\0') {
                      return;
                    }
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &((this->Internal).Pointer)->LinkOptionsEntries,&local_1d0);
                    cmMakefile::GetBacktrace(this->Makefile);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&((this->Internal).Pointer)->LinkOptionsBacktraces,
                              (value_type *)local_1a8);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)prop);
                    if (iVar3 == 0) {
                      if (local_1d0 == (char *)0x0) {
                        return;
                      }
                      if (*local_1d0 == '\0') {
                        return;
                      }
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&((this->Internal).Pointer)->LinkDirectoriesEntries,&local_1d0);
                      cmMakefile::GetBacktrace(this->Makefile);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&((this->Internal).Pointer)->LinkDirectoriesBacktraces,
                                (value_type *)local_1a8);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)prop);
                      if (iVar3 == 0) {
                        if (local_1d0 == (char *)0x0) {
                          return;
                        }
                        if (*local_1d0 == '\0') {
                          return;
                        }
                        cmMakefile::GetBacktrace(this->Makefile);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->Internal).Pointer)->LinkImplementationPropertyEntries
                                   ,&local_1d0);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                                  (value_type *)local_1a8);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)prop);
                        if (iVar3 != 0) {
                          iVar3 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
                          if (iVar3 != 0) {
                            cmPropertyMap::AppendProperty(&this->Properties,prop,local_1d0,asString)
                            ;
                            return;
                          }
                          pcVar1 = this->Makefile;
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1a8,prop," property may not be APPENDed.");
                          cmMakefile::IssueMessage
                                    (pcVar1,FATAL_ERROR,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                          if ((anon_union_72_2_0a0279e7_for_Entry_0 *)local_1a8._0_8_ == &local_198)
                          {
                            return;
                          }
                          operator_delete((void *)local_1a8._0_8_,
                                          (ulong)&((local_198.Bottom.State)->PropertyDefinitions).
                                                  _M_t._M_impl.field_0x1);
                          return;
                        }
                        cmMakefile::GetBacktrace(this->Makefile);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&((this->Internal).Pointer)->SourceEntries,&local_1d0);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&((this->Internal).Pointer)->SourceBacktraces,
                                  (value_type *)local_1a8);
                      }
                    }
                  }
                }
              }
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\"",
                   0x4b);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                            (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")\n",3);
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      this->Internal->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      this->Internal->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      this->Internal->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      this->Internal->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (value && *value) {
      this->Internal->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (value && *value) {
      this->Internal->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.emplace_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.emplace_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}